

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O1

int Pdr_ObjSatVar2(Pdr_Man_t *p,int k,Aig_Obj_t *pObj,int Level,int Pol)

{
  Vec_Int_t *p_00;
  sat_solver *s;
  int **ppiVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  Aig_Obj_t *pObj_00;
  int iVar6;
  uint *puVar7;
  long lVar8;
  size_t __size;
  int iVar9;
  Vec_Int_t *pVVar10;
  int Lit;
  int local_3c;
  sat_solver *local_38;
  
  if (p->pCnf2->pObj2Count[pObj->Id] < 0) {
    __assert_fail("p->pCnf2->pObj2Count[Aig_ObjId(pObj)] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                  ,0xb0,"int Pdr_ObjSatVar2FindOrAdd(Pdr_Man_t *, int, Aig_Obj_t *, int *)");
  }
  pVVar10 = p->pvId2Vars + pObj->Id;
  if ((pVVar10->nSize == 0) && (pVVar10->nCap <= k * 2)) {
    iVar6 = k * 2 + 1;
    __size = (long)iVar6 << 2;
    if (pVVar10->pArray == (int *)0x0) {
      piVar5 = (int *)malloc(__size);
    }
    else {
      piVar5 = (int *)realloc(pVVar10->pArray,__size);
    }
    pVVar10->pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_008f1b76;
    pVVar10->nCap = iVar6;
  }
  if (pVVar10->nSize <= k) {
    iVar9 = k + 1;
    iVar6 = pVVar10->nCap;
    iVar3 = iVar6 * 2;
    if (k < iVar3) {
      if (iVar6 < iVar3 && iVar6 <= k) {
        if (pVVar10->pArray == (int *)0x0) {
          piVar5 = (int *)malloc((long)iVar6 << 3);
        }
        else {
          piVar5 = (int *)realloc(pVVar10->pArray,(long)iVar6 << 3);
        }
        pVVar10->pArray = piVar5;
LAB_008f1767:
        if (piVar5 == (int *)0x0) {
LAB_008f1b76:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar10->nCap = iVar3;
      }
    }
    else if (iVar6 <= k) {
      if (pVVar10->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((long)iVar9 << 2);
      }
      else {
        piVar5 = (int *)realloc(pVVar10->pArray,(long)iVar9 << 2);
      }
      pVVar10->pArray = piVar5;
      iVar3 = iVar9;
      goto LAB_008f1767;
    }
    iVar6 = pVVar10->nSize;
    if (iVar6 <= k) {
      memset(pVVar10->pArray + iVar6,0,(ulong)(uint)(k - iVar6) * 4 + 4);
    }
    pVVar10->nSize = iVar9;
  }
  if ((-1 < k) && (k < pVVar10->nSize)) {
    iVar6 = pVVar10->pArray[(uint)k];
    if (iVar6 == 0) {
      if ((p->vSolvers->nSize <= k) || ((p->vVar2Ids).nSize <= k)) goto LAB_008f1adb;
      p_00 = (Vec_Int_t *)(p->vVar2Ids).pArray[(uint)k];
      iVar3 = p_00->nSize;
      if (iVar3 < 1) {
        __assert_fail("iVarNew > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                      ,0xb8,"int Pdr_ObjSatVar2FindOrAdd(Pdr_Man_t *, int, Aig_Obj_t *, int *)");
      }
      s = (sat_solver *)p->vSolvers->pArray[(uint)k];
      Vec_IntPush(p_00,pObj->Id);
      if (pVVar10->nSize <= k) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar10->pArray[(uint)k] = iVar3;
      sat_solver_setnvars(s,iVar3 + 1);
      if (((k == 0) && ((*(uint *)&pObj->field_0x18 & 7) == 2)) &&
         (p->pAig->nTruePis <= (pObj->field_0).CioId)) {
        local_3c = iVar3 * 2 + 1;
        iVar3 = sat_solver_addclause(s,&local_3c,(lit *)&local_38);
        if (iVar3 != 1) {
          __assert_fail("RetValue == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                        ,0xc0,"int Pdr_ObjSatVar2FindOrAdd(Pdr_Man_t *, int, Aig_Obj_t *, int *)");
        }
        if ((s->qtail != s->qhead) && (iVar3 = sat_solver_simplify(s), iVar3 == 0)) {
          __assert_fail("RetValue != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0x102,"void sat_solver_compress(sat_solver *)");
        }
      }
    }
    if (k < pVVar10->nSize) {
      iVar3 = pVVar10->pArray[(uint)k];
      if ((iVar6 == 0) && (((uint)*(undefined8 *)&pObj->field_0x18 & 7) != 2)) {
        iVar6 = p->pCnf2->pObj2Count[pObj->Id];
        if (iVar6 < 1) {
          __assert_fail("iClaBeg < iClaEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                        ,0xd2,"int Pdr_ObjSatVar2(Pdr_Man_t *, int, Aig_Obj_t *, int, int)");
        }
        if (p->vSolvers->nSize <= k) {
LAB_008f1adb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if ((Level < 0) || (p->vVLits->nSize <= Level)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        iVar9 = p->pCnf2->pObj2Clause[pObj->Id];
        iVar6 = iVar6 + iVar9;
        local_38 = (sat_solver *)p->vSolvers->pArray[(uint)k];
        pVVar10 = p->vVLits->pArray + (uint)Level;
        if (iVar6 < iVar9) {
          iVar6 = iVar9;
        }
        lVar8 = (long)iVar9;
        while (lVar8 != iVar6) {
          pVVar10->nSize = 0;
          uVar4 = *p->pCnf2->pClauses[lVar8];
          if ((int)uVar4 < 0) {
LAB_008f1a7e:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if (iVar3 < 0) {
LAB_008f1a9d:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush(pVVar10,uVar4 & 1 | iVar3 * 2);
          ppiVar1 = p->pCnf2->pClauses;
          puVar7 = (uint *)(ppiVar1[lVar8] + 1);
          if (puVar7 < ppiVar1[lVar8 + 1]) {
            do {
              if ((int)*puVar7 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              pVVar2 = p->pAig->vObjs;
              if (pVVar2 == (Vec_Ptr_t *)0x0) {
                pObj_00 = (Aig_Obj_t *)0x0;
              }
              else {
                uVar4 = *puVar7 >> 1;
                if (pVVar2->nSize <= (int)uVar4) goto LAB_008f1adb;
                pObj_00 = (Aig_Obj_t *)pVVar2->pArray[uVar4];
              }
              iVar9 = Pdr_ObjSatVar2(p,k,pObj_00,Level + 1,Pol);
              if ((int)*puVar7 < 0) goto LAB_008f1a7e;
              if (iVar9 < 0) goto LAB_008f1a9d;
              Vec_IntPush(pVVar10,(*puVar7 & 1) + iVar9 * 2);
              puVar7 = puVar7 + 1;
            } while (puVar7 < p->pCnf2->pClauses[lVar8 + 1]);
          }
          iVar9 = sat_solver_addclause(local_38,pVVar10->pArray,pVVar10->pArray + pVVar10->nSize);
          lVar8 = lVar8 + 1;
          if (iVar9 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                          ,0xdf,"int Pdr_ObjSatVar2(Pdr_Man_t *, int, Aig_Obj_t *, int, int)");
          }
        }
      }
      return iVar3;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Pdr_ObjSatVar2( Pdr_Man_t * p, int k, Aig_Obj_t * pObj, int Level, int Pol )
{
    Vec_Int_t * vLits;
    sat_solver * pSat;
    int fNewVar = 0, iVarThis  = Pdr_ObjSatVar2FindOrAdd( p, k, pObj, &fNewVar );
    int * pLit, i, iVar, iClaBeg, iClaEnd, RetValue;
    if ( Aig_ObjIsCi(pObj) || !fNewVar )
        return iVarThis;
    iClaBeg = p->pCnf2->pObj2Clause[Aig_ObjId(pObj)];
    iClaEnd = iClaBeg + p->pCnf2->pObj2Count[Aig_ObjId(pObj)];
    assert( iClaBeg < iClaEnd );
    pSat = Pdr_ManSolver(p, k);
    vLits = Vec_WecEntry( p->vVLits, Level );
    for ( i = iClaBeg; i < iClaEnd; i++ )
    {
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_Var2Lit( iVarThis, Abc_LitIsCompl(p->pCnf2->pClauses[i][0]) ) );
        for ( pLit = p->pCnf2->pClauses[i]+1; pLit < p->pCnf2->pClauses[i+1]; pLit++ )
        {
            iVar = Pdr_ObjSatVar2( p, k, Aig_ManObj(p->pAig, Abc_Lit2Var(*pLit)), Level+1, Pol );
            Vec_IntPush( vLits, Abc_Var2Lit( iVar, Abc_LitIsCompl(*pLit) ) );
        }
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits)+Vec_IntSize(vLits) );
        assert( RetValue );
        (void) RetValue;
    }
    return iVarThis;
}